

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VConst_Serial(realtype c,N_Vector z)

{
  int iVar1;
  long lVar2;
  realtype *zd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  realtype c_local;
  
  iVar1 = *z->content;
  lVar2 = *(long *)((long)z->content + 8);
  for (i = 0; i < iVar1; i = i + 1) {
    *(realtype *)(lVar2 + (long)i * 8) = c;
  }
  return;
}

Assistant:

void N_VConst_Serial(realtype c, N_Vector z)
{
  sunindextype i, N;
  realtype *zd;

  zd = NULL;

  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) zd[i] = c;

  return;
}